

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26552d::CpuIntegrationTest_branch_Test::~CpuIntegrationTest_branch_Test
          (CpuIntegrationTest_branch_Test *this)

{
  CpuIntegrationTest_branch_Test *this_local;
  
  ~CpuIntegrationTest_branch_Test(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(CpuIntegrationTest, branch) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 08     LDX #$08
    // $0602    ca        DEX
    // $0603    8e 00 02  STX $0200
    // $0606    e0 03     CPX #$03
    // $0608    d0 f8     BNE $0602
    // $060a    8e 01 02  STX $0201
    // $060d    00        BRK
    load_hex_dump(0x0600,
            {0xa2,
                    0x08,
                    0xca,
                    0x8e,
                    0x00,
                    0x02,
                    0xe0,
                    0x03,
                    0xd0,
                    0xf8,
                    0x8e,
                    0x01,
                    0x02,
                    0x00,
                    0x00}); // Needed for previous BRK dummy read

    set_reset_address(0x0600);
    set_break_address(0xDEAD);

    expected.a = 0x00;
    expected.x = 0x03;
    expected.y = 0x00;
    expected.sp =
            registers.sp - static_cast<uint8_t>(3); // PC (2 bytes) + P (1 byte)
    expected.pc = 0xDEAD;
    expected.p = C_FLAG | Z_FLAG;

    // BNE takes 3 cycles when branch is taken, two when it is not.
    const int expected_cycles =
            2 + (2 + 4 + 2 + 3) * 4 + (2 + 4 + 2 + 2) + 4 + 7;

    EXPECT_EQ(expected_cycles, run_until_brk());
    EXPECT_EQ(expected, registers);
}